

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::FieldDescriptorProto::SerializeWithCachedSizesToArray
          (FieldDescriptorProto *this,uint8 *target)

{
  bool bVar1;
  int32 value;
  FieldDescriptorProto_Label value_00;
  FieldDescriptorProto_Type value_01;
  int iVar2;
  uint32 uVar3;
  char *pcVar4;
  string *psVar5;
  FieldOptions *this_00;
  uint8 *puVar6;
  UnknownFieldSet *pUVar7;
  byte *local_230;
  uint8 *target_local;
  FieldDescriptorProto *this_local;
  byte *local_b8;
  byte *local_a0;
  byte *local_88;
  uint8 *local_70;
  byte *local_58;
  byte *local_40;
  byte *local_28;
  byte *local_10;
  
  bVar1 = has_name(this);
  local_230 = target;
  if (bVar1) {
    name_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar4,iVar2,SERIALIZE);
    psVar5 = name_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *target = (byte)uVar3;
      local_70 = target + 1;
    }
    else if (uVar3 < 0x4000) {
      *target = (byte)uVar3 | 0x80;
      target[1] = (uint8)(uVar3 >> 7);
      local_70 = target + 2;
    }
    else {
      local_70 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target);
    }
    uVar3 = std::__cxx11::string::size();
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_70);
    local_230 = io::CodedOutputStream::WriteStringToArray(psVar5,puVar6);
  }
  bVar1 = has_extendee(this);
  if (bVar1) {
    extendee_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    extendee_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar4,iVar2,SERIALIZE);
    psVar5 = extendee_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(2,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *local_230 = (byte)uVar3;
      local_88 = local_230 + 1;
    }
    else if (uVar3 < 0x4000) {
      *local_230 = (byte)uVar3 | 0x80;
      local_230[1] = (byte)(uVar3 >> 7);
      local_88 = local_230 + 2;
    }
    else {
      local_88 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,local_230);
    }
    uVar3 = std::__cxx11::string::size();
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_88);
    local_230 = io::CodedOutputStream::WriteStringToArray(psVar5,puVar6);
  }
  bVar1 = has_number(this);
  if (bVar1) {
    value = number(this);
    uVar3 = internal::WireFormatLite::MakeTag(3,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *local_230 = (byte)uVar3;
      local_58 = local_230 + 1;
    }
    else if (uVar3 < 0x4000) {
      *local_230 = (byte)uVar3 | 0x80;
      local_230[1] = (byte)(uVar3 >> 7);
      local_58 = local_230 + 2;
    }
    else {
      local_58 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,local_230);
    }
    local_230 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(value,local_58);
  }
  bVar1 = has_label(this);
  if (bVar1) {
    value_00 = label(this);
    uVar3 = internal::WireFormatLite::MakeTag(4,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *local_230 = (byte)uVar3;
      local_28 = local_230 + 1;
    }
    else if (uVar3 < 0x4000) {
      *local_230 = (byte)uVar3 | 0x80;
      local_230[1] = (byte)(uVar3 >> 7);
      local_28 = local_230 + 2;
    }
    else {
      local_28 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,local_230);
    }
    local_230 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(value_00,local_28);
  }
  bVar1 = has_type(this);
  if (bVar1) {
    value_01 = type(this);
    uVar3 = internal::WireFormatLite::MakeTag(5,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *local_230 = (byte)uVar3;
      local_40 = local_230 + 1;
    }
    else if (uVar3 < 0x4000) {
      *local_230 = (byte)uVar3 | 0x80;
      local_230[1] = (byte)(uVar3 >> 7);
      local_40 = local_230 + 2;
    }
    else {
      local_40 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,local_230);
    }
    local_230 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(value_01,local_40);
  }
  bVar1 = has_type_name(this);
  if (bVar1) {
    type_name_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    type_name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar4,iVar2,SERIALIZE);
    psVar5 = type_name_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(6,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *local_230 = (byte)uVar3;
      local_a0 = local_230 + 1;
    }
    else if (uVar3 < 0x4000) {
      *local_230 = (byte)uVar3 | 0x80;
      local_230[1] = (byte)(uVar3 >> 7);
      local_a0 = local_230 + 2;
    }
    else {
      local_a0 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,local_230);
    }
    uVar3 = std::__cxx11::string::size();
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_a0);
    local_230 = io::CodedOutputStream::WriteStringToArray(psVar5,puVar6);
  }
  bVar1 = has_default_value(this);
  if (bVar1) {
    default_value_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    default_value_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar4,iVar2,SERIALIZE);
    psVar5 = default_value_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(7,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *local_230 = (byte)uVar3;
      local_b8 = local_230 + 1;
    }
    else if (uVar3 < 0x4000) {
      *local_230 = (byte)uVar3 | 0x80;
      local_230[1] = (byte)(uVar3 >> 7);
      local_b8 = local_230 + 2;
    }
    else {
      local_b8 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,local_230);
    }
    uVar3 = std::__cxx11::string::size();
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_b8);
    local_230 = io::CodedOutputStream::WriteStringToArray(psVar5,puVar6);
  }
  bVar1 = has_options(this);
  if (bVar1) {
    this_00 = options(this);
    uVar3 = internal::WireFormatLite::MakeTag(8,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *local_230 = (byte)uVar3;
      local_10 = local_230 + 1;
    }
    else if (uVar3 < 0x4000) {
      *local_230 = (byte)uVar3 | 0x80;
      local_230[1] = (byte)(uVar3 >> 7);
      local_10 = local_230 + 2;
    }
    else {
      local_10 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,local_230);
    }
    uVar3 = FieldOptions::GetCachedSize(this_00);
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_10);
    local_230 = FieldOptions::SerializeWithCachedSizesToArray(this_00,puVar6);
  }
  pUVar7 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar7);
  if (!bVar1) {
    pUVar7 = unknown_fields(this);
    local_230 = internal::WireFormat::SerializeUnknownFieldsToArray(pUVar7,local_230);
  }
  return local_230;
}

Assistant:

::google::protobuf::uint8* FieldDescriptorProto::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string extendee = 2;
  if (has_extendee()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->extendee().data(), this->extendee().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->extendee(), target);
  }

  // optional int32 number = 3;
  if (has_number()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->number(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
  if (has_label()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      4, this->label(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
  if (has_type()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      5, this->type(), target);
  }

  // optional string type_name = 6;
  if (has_type_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->type_name().data(), this->type_name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        6, this->type_name(), target);
  }

  // optional string default_value = 7;
  if (has_default_value()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->default_value().data(), this->default_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        7, this->default_value(), target);
  }

  // optional .google.protobuf.FieldOptions options = 8;
  if (has_options()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        8, this->options(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}